

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O2

void nukedopll_update(void *chipptr,UINT32 samples,DEV_SMPL **out)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int32_t buffer [2];
  int local_50;
  int local_4c;
  DEV_SMPL **local_48;
  ulong local_40;
  ulong local_38;
  
  local_40 = (ulong)samples;
  local_38 = 0;
  local_48 = out;
  do {
    if (local_38 == local_40) {
      return;
    }
    iVar4 = *(int *)((long)chipptr + 0x1d0);
    iVar6 = *(int *)((long)chipptr + 0x1d4);
    while (iVar7 = iVar4 - iVar6, iVar7 == 0 || iVar4 < iVar6) {
      *(undefined8 *)((long)chipptr + 0x1d8) = *(undefined8 *)((long)chipptr + 0x1e0);
      *(undefined8 *)((long)chipptr + 0x1e0) = 0;
      for (iVar4 = 0; iVar4 != 0x12; iVar4 = iVar4 + 1) {
        iVar6 = 0;
        iVar7 = 0;
        switch(*(undefined4 *)((long)chipptr + 0x14)) {
        case 1:
          iVar8 = *(int *)((long)chipptr + 0x1b0);
          iVar7 = *(int *)((long)chipptr + 0x1bc);
          break;
        case 2:
          iVar8 = *(int *)((long)chipptr + 0x1b4);
          iVar7 = *(int *)((long)chipptr + 0x1c0);
          break;
        case 3:
          iVar8 = *(int *)((long)chipptr + 0x1b8);
          iVar7 = *(int *)((long)chipptr + 0x1c8);
          break;
        case 4:
        case 0x11:
          iVar6 = *(int *)((long)chipptr + 0x1cc);
        case 0xc:
        case 0x10:
switchD_00122387_caseD_c:
          iVar8 = 0;
          iVar7 = iVar6;
          break;
        default:
          iVar6 = *(int *)((long)chipptr + 0x1c4);
          goto switchD_00122387_caseD_c;
        case 6:
          iVar6 = *(int *)((long)chipptr + 0x1bc);
          goto switchD_00122387_caseD_c;
        case 7:
          iVar8 = *(int *)((long)chipptr + 0x198);
          break;
        case 8:
          iVar8 = *(int *)((long)chipptr + 0x19c);
          break;
        case 9:
          iVar8 = *(int *)((long)chipptr + 0x1a0);
          break;
        case 10:
          iVar6 = *(int *)((long)chipptr + 0x1c0);
          goto switchD_00122387_caseD_c;
        case 0xb:
          iVar6 = *(int *)((long)chipptr + 0x1c8);
          goto switchD_00122387_caseD_c;
        case 0xd:
          iVar8 = *(int *)((long)chipptr + 0x1a4);
          iVar7 = iVar6;
          break;
        case 0xe:
          iVar8 = *(int *)((long)chipptr + 0x1a8);
          iVar7 = iVar6;
          break;
        case 0xf:
          iVar8 = *(int *)((long)chipptr + 0x1ac);
          iVar7 = iVar6;
        }
        NOPLL_Clock((opll_t *)chipptr,&local_50);
        if (iVar8 == 0) {
          *(int *)((long)chipptr + 0x1e0) = *(int *)((long)chipptr + 0x1e0) + local_50;
        }
        if (iVar7 == 0) {
          *(int *)((long)chipptr + 0x1e4) = *(int *)((long)chipptr + 0x1e4) + local_4c;
        }
        uVar5 = *(uint *)((long)chipptr + 0x1f0);
        while( true ) {
          lVar3 = (ulong)uVar5 * 0x10;
          if ((*(ulong *)((long)chipptr + 0x1e8) < *(ulong *)((long)chipptr + lVar3 + 0x200)) ||
             (bVar1 = *(byte *)((long)chipptr + lVar3 + 0x208), (bVar1 & 4) == 0)) break;
          uVar5 = bVar1 & 3;
          *(char *)((long)chipptr + lVar3 + 0x208) = (char)uVar5;
          NOPLL_Write((opll_t *)chipptr,uVar5,*(uint8_t *)((long)chipptr + lVar3 + 0x209));
          uVar5 = *(int *)((long)chipptr + 0x1f0) + 1U & 0x7ff;
          *(uint *)((long)chipptr + 0x1f0) = uVar5;
        }
        *(ulong *)((long)chipptr + 0x1e8) = *(ulong *)((long)chipptr + 0x1e8) + 1;
      }
      iVar4 = (*(int *)((long)chipptr + 0x1e4) + *(int *)((long)chipptr + 0x1e0)) * 8;
      *(int *)((long)chipptr + 0x1e0) = iVar4;
      *(int *)((long)chipptr + 0x1e4) = iVar4;
      iVar4 = *(int *)((long)chipptr + 0x1d0);
      iVar6 = *(int *)((long)chipptr + 0x1d4) - iVar4;
      *(int *)((long)chipptr + 0x1d4) = iVar6;
    }
    iVar8 = *(int *)((long)chipptr + 0x1dc);
    iVar2 = *(int *)((long)chipptr + 0x1e4);
    *(int *)((long)chipptr + 0x1d4) = iVar6 + 0x400;
    (*local_48)[local_38] =
         (*(int *)((long)chipptr + 0x1e0) * iVar6 + *(int *)((long)chipptr + 0x1d8) * iVar7) / iVar4
    ;
    local_48[1][local_38] = (iVar2 * iVar6 + iVar7 * iVar8) / iVar4;
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

static void nukedopll_update(void *chipptr, UINT32 samples, DEV_SMPL **out)
{
	opll_t *chip = (opll_t *)chipptr;
	int32_t buffer[2];
	UINT32 i;
	
	for (i = 0; i < samples; i ++)
	{
		OPLL_GenerateResampled(chip, buffer);
		out[0][i] = buffer[0];
		out[1][i] = buffer[1];
	}
	
	return;
}